

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

void __thiscall
QVLABase<char16_t>::resize_impl
          (QVLABase<char16_t> *this,qsizetype prealloc,void *array,qsizetype sz)

{
  qsizetype in_RCX;
  QVLABaseBase *in_RDI;
  long in_FS_OFFSET;
  qsizetype unaff_retaddr;
  QVLABase<char16_t> *in_stack_00000008;
  qsizetype in_stack_00000020;
  size_type local_18;
  qsizetype local_10;
  void *array_00;
  
  array_00 = *(void **)(in_FS_OFFSET + 0x28);
  local_10 = in_RCX;
  local_18 = QVLABaseBase::capacity(in_RDI);
  qMax<long_long>(&local_10,&local_18);
  reallocate_impl(in_stack_00000008,unaff_retaddr,array_00,(qsizetype)array,in_stack_00000020);
  in_RDI->s = local_10;
  if (*(void **)(in_FS_OFFSET + 0x28) == array_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void resize_impl(qsizetype prealloc, void *array, qsizetype sz)
    {
        reallocate_impl(prealloc, array, sz, qMax(sz, capacity()));
        if constexpr (QTypeInfo<T>::isComplex) {
            // call default constructor for new objects (which can throw)
            while (size() < sz) {
                q20::construct_at(data() + size());
                ++s;
            }
        } else {
            s = sz;
        }
    }